

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

string * __thiscall
argvParser::getHelpMessage_abi_cxx11_(string *__return_storage_ptr__,argvParser *this)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *this_00;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *this_01;
  value_type paVar1;
  bool bVar2;
  reference ppsVar3;
  reference ppaVar4;
  size_type __n;
  ulong __n_00;
  string requiredArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  value_type local_120;
  size_type local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_140,&(this->super_argParserAdvancedConfiguration).applicationName,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_140);
  std::operator+(&local_140,&this->description,"\nUsage:\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_140);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  __n = 0;
  while (this_00 = (this->super_argParserAdvancedConfiguration).newargconfig,
        __n < (ulong)((long)(this_00->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_118 = __n;
    ppsVar3 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at(this_00,__n);
    local_120 = *ppsVar3;
    if ((local_120->sectionName)._M_string_length != 0) {
      std::operator+(&local_110," ",&local_120->sectionName);
      std::operator+(&local_160,&local_110,": \n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_110);
    }
    for (__n_00 = 0; this_01 = local_120->arguments,
        __n_00 < (ulong)((long)(this_01->
                               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->
                               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1
        ) {
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at(this_01,__n_00);
      paVar1 = *ppaVar4;
      std::__cxx11::string::string((string *)&local_90,(string *)paVar1);
      std::__cxx11::string::string((string *)&local_b0,(string *)&paVar1->argLong);
      std::__cxx11::string::string((string *)&local_50,(string *)&paVar1->helpMessage);
      argParserAdvancedConfiguration::buildHelpLine
                (&local_160,&this->super_argParserAdvancedConfiguration,&local_90,&local_b0,
                 &local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      if (paVar1->requiredAndNotHitJet == true) {
        std::__cxx11::string::string((string *)&local_d0,(string *)paVar1);
        std::__cxx11::string::string((string *)&local_f0,(string *)&paVar1->argLong);
        std::__cxx11::string::string((string *)&local_70,(string *)&paVar1->helpMessage);
        argParserAdvancedConfiguration::buildHelpLine
                  (&local_160,&this->super_argParserAdvancedConfiguration,&local_d0,&local_f0,
                   &local_70);
        std::__cxx11::string::append((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
    __n = local_118 + 1;
  }
  bVar2 = foundAllRequierdArgs(this);
  if (!bVar2) {
    std::operator+(&local_110,"\nrequired arguments are : \n",&local_140);
    std::operator+(&local_160,&local_110,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((this->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length != 0) {
    std::operator+(&local_160,"failed argument : ",
                   &(this->super_argParserAdvancedConfiguration).lastFailedArg);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_160);
    if ((this->super_argParserAdvancedConfiguration).errorMessage._M_string_length != 0) {
      std::operator+(&local_160,"\n  ",&(this->super_argParserAdvancedConfiguration).errorMessage);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_160);
    }
  }
  std::__cxx11::string::~string((string *)&local_140);
  return __return_storage_ptr__;
}

Assistant:

string argvParser::getHelpMessage() {
    string s;
    s += applicationName + "\n";
    s += description + "\nUsage:\n";
    string requiredArgs;
    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++ ){
        section *sec = newargconfig->at(secIndex);
        if(!sec->sectionName.empty()){
            s+= " " + sec->sectionName + ": \n";
        }
        for(int argIndex = 0; argIndex<sec->arguments->size();argIndex++){
            argument * arg = sec->arguments->at(argIndex);
            s += buildHelpLine(arg->argShort,arg->argLong,arg->helpMessage);
            if(arg->requiredAndNotHitJet)
                requiredArgs += buildHelpLine(arg->argShort, arg->argLong, arg->helpMessage);
        }
    }
    if (!foundAllRequierdArgs()) {
        s += "\nrequired arguments are : \n" + requiredArgs + "\n";
    }

    if (!lastFailedArg.empty()) {
        s += "failed argument : " + lastFailedArg;
        if (!errorMessage.empty()) {
            s += "\n  " + errorMessage;
        }
    }

    return s;
}